

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImGuiTabBar *tab_bar;
  ImGuiContext *pIVar1;
  bool bVar2;
  
  pIVar1 = GImGui;
  if (GImGui->CurrentWindow->SkipItems == false) {
    tab_bar = (GImGui->CurrentTabBar).Data[(long)(GImGui->CurrentTabBar).Size + -1];
    bVar2 = TabItemEx(tab_bar,label,p_open,flags);
    if (((flags & 8U) == 0) && (bVar2)) {
      ImVector<unsigned_int>::push_back
                (&pIVar1->CurrentWindow->IDStack,&(tab_bar->Tabs).Data[tab_bar->LastTabItemIdx].ID);
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow->SkipItems)
        return false;

    IM_ASSERT(g.CurrentTabBar.Size > 0 && "Needs to be called between BeginTabBar() and EndTabBar()!");
    ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
    bool ret = TabItemEx(tab_bar, label, p_open, flags);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        g.CurrentWindow->IDStack.push_back(tab->ID);    // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}